

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::IfExpr::do_evaluate
          (Value *__return_storage_ptr__,IfExpr *this,shared_ptr<minja::Context> *context)

{
  Expression *this_00;
  bool bVar1;
  runtime_error *this_01;
  element_type *this_02;
  Value local_78;
  
  this_00 = (this->condition).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 == (Expression *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"IfExpr.condition is null");
  }
  else {
    if ((this->then_expr).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      Expression::evaluate(&local_78,this_00,context);
      bVar1 = Value::to_bool(&local_78);
      Value::~Value(&local_78);
      if (bVar1) {
        this_02 = (this->then_expr).
                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      else {
        this_02 = (this->else_expr).
                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (this_02 == (element_type *)0x0) {
          local_78.super_enable_shared_from_this<minja::Value>._M_weak_this.
          super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          Value::Value(__return_storage_ptr__,(nullptr_t *)&local_78);
          return __return_storage_ptr__;
        }
      }
      Expression::evaluate(__return_storage_ptr__,this_02,context);
      return __return_storage_ptr__;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"IfExpr.then_expr is null");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
      if (!condition) throw std::runtime_error("IfExpr.condition is null");
      if (!then_expr) throw std::runtime_error("IfExpr.then_expr is null");
      if (condition->evaluate(context).to_bool()) {
        return then_expr->evaluate(context);
      }
      if (else_expr) {
        return else_expr->evaluate(context);
      }
      return nullptr;
    }